

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

string * stringformat<long>(string *__return_storage_ptr__,char *fmt,long *args)

{
  StringFormatter<long> local_1b8;
  stringstream local_1a8 [8];
  stringstream buf;
  ostream local_198 [376];
  long *local_20;
  long *args_local;
  char *fmt_local;
  
  local_20 = args;
  args_local = (long *)fmt;
  fmt_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  StringFormatter<long>::StringFormatter(&local_1b8,(char *)args_local,local_20);
  operator<<(local_198,&local_1b8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}